

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::BaseRockSample::InitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          BaseRockSample *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  State *local_30;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = (byte)this->num_rocks_;
  bVar2 = bVar1 & 0x1f;
  iVar3 = 1 << bVar2;
  iVar5 = (int)((ulong)*(undefined8 *)&this->start_pos_ >> 0x20) * (this->grid_).xsize_ +
          (int)*(undefined8 *)&this->start_pos_ << (bVar1 & 0x1f);
  iVar4 = 0;
  if (0 < 1 << bVar2) {
    iVar4 = iVar3;
  }
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    local_30 = (State *)(**(code **)(*(long *)this + 0xb8))(SUB84(1.0 / (double)iVar3,0),this,iVar5)
    ;
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
               &local_30);
    iVar5 = iVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> BaseRockSample::InitialParticleSet() const {
	vector<State*> particles;
	int N = 1 << num_rocks_, pos = CoordToIndex(start_pos_) * (1 << num_rocks_);
	for (int n = 0; n < N; n++) {
		RockSampleState* rockstate = static_cast<RockSampleState*>(Allocate(
			n + pos, 1.0 / N));
		particles.push_back(rockstate);
	}
	return particles;
}